

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Path * Path::canonicalized(Path *__return_storage_ptr__,Path *path)

{
  size_t sVar1;
  size_t sVar2;
  undefined1 local_38 [8];
  Path p;
  Path *path_local;
  
  p.super_String.mString.field_2._8_8_ = path;
  Path((Path *)local_38,path);
  sVar1 = canonicalize((Path *)local_38);
  sVar2 = String::size((String *)p.super_String.mString.field_2._8_8_);
  if (sVar1 == sVar2) {
    Path(__return_storage_ptr__,(Path *)p.super_String.mString.field_2._8_8_);
  }
  else {
    Path(__return_storage_ptr__,(Path *)local_38);
  }
  ~Path((Path *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Path Path::canonicalized(const Path &path)
{
    Path p = path;
    if (p.canonicalize() != path.size())
        return p;
    return path; // same as above
}